

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O2

int kftp_connect(knetFile *ftp)

{
  int iVar1;
  
  iVar1 = socket_connect(ftp->host,ftp->port);
  ftp->ctrl_fd = iVar1;
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    kftp_get_response(ftp);
    kftp_send_cmd(ftp,"USER anonymous\r\n",1);
    kftp_send_cmd(ftp,"PASS kftp@\r\n",1);
    kftp_send_cmd(ftp,"TYPE I\r\n",1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int kftp_connect(knetFile *ftp)
{
	ftp->ctrl_fd = socket_connect(ftp->host, ftp->port);
	if (ftp->ctrl_fd == -1) return -1;
	kftp_get_response(ftp);
	kftp_send_cmd(ftp, "USER anonymous\r\n", 1);
	kftp_send_cmd(ftp, "PASS kftp@\r\n", 1);
	kftp_send_cmd(ftp, "TYPE I\r\n", 1);
	return 0;
}